

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O1

uintptr_t __thiscall r_comp::Metadata::get_sys_classes_size(Metadata *this)

{
  long lVar1;
  uintptr_t uVar2;
  _Hash_node_base *p_Var3;
  
  uVar2 = 1;
  for (p_Var3 = (this->sys_classes)._M_h._M_before_begin._M_nxt; p_Var3 != (_Hash_node_base *)0x0;
      p_Var3 = p_Var3->_M_nxt) {
    lVar1 = r_code::GetStringSize((string *)(p_Var3 + 1));
    uVar2 = uVar2 + lVar1 + 1;
  }
  return uVar2;
}

Assistant:

uintptr_t Metadata::get_sys_classes_size()
{
    size_t size = 1; // size of the hash table

    for (const auto &elem : sys_classes) {
        size += r_code::GetStringSize(elem.first) + 1;    // +1: index to the class in the class array
    }

    return size;
}